

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O0

bool rapidjson::internal::StrtodFast(double d,int p,double *result)

{
  double dVar1;
  double *result_local;
  double dStack_18;
  int p_local;
  double d_local;
  
  result_local._4_4_ = p;
  dStack_18 = d;
  if ((0x16 < p) && (p < 0x26)) {
    dStack_18 = Pow10(p + -0x16);
    dStack_18 = dStack_18 * d;
    result_local._4_4_ = 0x16;
  }
  if (((result_local._4_4_ < -0x16) || (0x16 < result_local._4_4_)) ||
     (9007199254740991.0 < dStack_18)) {
    d_local._7_1_ = false;
  }
  else {
    dVar1 = FastPath(dStack_18,result_local._4_4_);
    *result = dVar1;
    d_local._7_1_ = true;
  }
  return d_local._7_1_;
}

Assistant:

inline bool StrtodFast(double d, int p, double* result) {
    // Use fast path for string-to-double conversion if possible
    // see http://www.exploringbinary.com/fast-path-decimal-to-floating-point-conversion/
    if (p > 22  && p < 22 + 16) {
        // Fast Path Cases In Disguise
        d *= internal::Pow10(p - 22);
        p = 22;
    }

    if (p >= -22 && p <= 22 && d <= 9007199254740991.0) { // 2^53 - 1
        *result = FastPath(d, p);
        return true;
    }
    else
        return false;
}